

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ps_static.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_ps_static::load(xr_level_ps_static *this,xr_reader *r)

{
  uint16_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  particle_data *this_00;
  particle_data *local_30;
  particle_data *particle;
  xr_reader *s;
  xr_reader *pxStack_18;
  uint32_t id;
  xr_reader *r_local;
  xr_level_ps_static *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar3 = xr_reader::find_chunk(r,0);
  if (sVar3 == 4) {
    uVar2 = xr_reader::r_u32(pxStack_18);
    this->m_version = uVar2;
    if (this->m_version != 1) {
      __assert_fail("m_version == PS_VERSION_1",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_ps_static.cxx"
                    ,0x10,"void xray_re::xr_level_ps_static::load(xr_reader &)");
    }
  }
  else {
    this->m_version = 0;
  }
  s._4_4_ = (uint)(this->m_version != 0);
  while (particle = (particle_data *)xr_reader::open_chunk(pxStack_18,s._4_4_),
        particle != (particle_data *)0x0) {
    this_00 = (particle_data *)operator_new(0x68);
    particle_data::particle_data(this_00);
    local_30 = this_00;
    std::vector<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>::push_back
              (&this->m_particles,&local_30);
    if (this->m_version == 0) {
      uVar1 = 0xffff;
    }
    else {
      uVar1 = xr_reader::r_u16(pxStack_18);
    }
    local_30->extra = uVar1;
    xr_reader::r_sz(pxStack_18,&local_30->reference);
    xr_reader::r<xray_re::_matrix<float>>(pxStack_18,&local_30->xform);
    xr_reader::close_chunk(pxStack_18,(xr_reader **)&particle);
    s._4_4_ = s._4_4_ + 1;
  }
  return;
}

Assistant:

void xr_level_ps_static::load(xr_reader& r)
{
	if (r.find_chunk(PS_CHUNK_VERSION) == sizeof(uint32_t)) {
		m_version = r.r_u32();
		xr_assert(m_version == PS_VERSION_1);
	} else {
		m_version = PS_VERSION_0;
	}
	// compiler will optimize this, so no explicit (id = version) trick.
	uint32_t id = (m_version == PS_VERSION_0) ? 0 : 1;
	for (xr_reader* s; (s = r.open_chunk(id)); ++id) {
		particle_data* particle = new particle_data;
		m_particles.push_back(particle);
		particle->extra = (m_version == PS_VERSION_0) ? 0xffff : r.r_u16();
		r.r_sz(particle->reference);
		r.r(particle->xform);
		r.close_chunk(s);
	}
}